

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall BuildWithDepsLogTestObsoleteDeps::Run(BuildWithDepsLogTestObsoleteDeps *this)

{
  VirtualFileSystem *this_00;
  __node_base *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  size_type sVar4;
  Test *pTVar5;
  StateTestWithBuiltinRules *pSVar6;
  _Head_base<0UL,_CommandRunner_*,_false> _Var7;
  bool bVar8;
  bool condition;
  int iVar9;
  int iVar10;
  LoadStatus LVar11;
  Node *pNVar12;
  TimeStamp TVar13;
  string err;
  Builder builder;
  State state;
  DepsLog deps_log;
  string local_2e8;
  StateTestWithBuiltinRules *local_2c8;
  string local_2c0;
  undefined1 local_2a0 [128];
  _Head_base<0UL,_CommandRunner_*,_false> local_220;
  undefined1 local_1c8 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  local_190;
  pointer local_160;
  pointer local_150;
  undefined **local_148;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  local_110;
  pointer local_d8;
  pointer local_c8;
  size_type *local_c0;
  BuildConfig *local_b8;
  string local_b0;
  DepsLog local_90;
  
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  pcVar3 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"in1","");
  pcVar2 = local_2a0 + 0x10;
  local_2a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,(string *)local_1c8,(string *)local_2a0);
  if ((pointer)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  if ((pointer)local_1c8._0_8_ != pcVar3) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  local_1c8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"in1.d","");
  local_2a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"out: ","");
  VirtualFileSystem::Create(this_00,(string *)local_1c8,(string *)local_2a0);
  if ((pointer)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  if ((pointer)local_1c8._0_8_ != pcVar3) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  State::State((State *)local_1c8);
  iVar9 = g_current_test->assertion_failures_;
  local_2c8 = (StateTestWithBuiltinRules *)this;
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,(State *)local_1c8);
  iVar10 = g_current_test->assertion_failures_;
  if (iVar9 == iVar10) {
    AssertParse((State *)local_1c8,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                (ManifestParserOptions)0x0);
    pTVar5 = g_current_test;
    iVar10 = g_current_test->assertion_failures_;
    if (iVar9 != iVar10) goto LAB_0013117b;
    local_90.file_path_._M_dataplus._M_p = (pointer)&local_90.file_path_.field_2;
    local_90.needs_recompaction_ = false;
    local_90.file_ = (FILE *)0x0;
    local_90.file_path_._M_string_length = 0;
    local_90.file_path_.field_2._M_local_buf[0] = '\0';
    local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"ninja_deps","");
    bVar8 = DepsLog::OpenForWrite(&local_90,(string *)local_2a0,&local_2c0);
    bVar8 = testing::Test::Check
                      (pTVar5,bVar8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x890,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    if ((pointer)local_2a0._0_8_ != pcVar2) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    pTVar5 = g_current_test;
    if (!bVar8) {
LAB_00131232:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      DepsLog::~DepsLog(&local_90);
      goto LAB_00131184;
    }
    iVar9 = std::__cxx11::string::compare((char *)&local_2c0);
    bVar8 = testing::Test::Check
                      (pTVar5,iVar9 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x891,"\"\" == err");
    pSVar6 = local_2c8;
    if (!bVar8) goto LAB_00131232;
    local_b8 = (BuildConfig *)&local_2c8[1].super_Test.failed_;
    Builder::Builder((Builder *)local_2a0,(State *)local_1c8,local_b8,(BuildLog *)0x0,&local_90,
                     &this_00->super_DiskInterface);
    local_c0 = &pSVar6[1].state_.paths_._M_h._M_element_count;
    _Var7._M_head_impl = (CommandRunner *)local_c0;
    if (local_220._M_head_impl != (CommandRunner *)0x0) {
      sVar4 = *(size_type *)local_220._M_head_impl;
      local_220._M_head_impl = (CommandRunner *)local_c0;
      (**(code **)(sVar4 + 8))();
      _Var7._M_head_impl = local_220._M_head_impl;
    }
    local_220._M_head_impl = _Var7._M_head_impl;
    pTVar5 = g_current_test;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"out","");
    pNVar12 = Builder::AddTarget((Builder *)local_2a0,&local_2e8,&local_2c0);
    testing::Test::Check
              (pTVar5,pNVar12 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x895,"builder.AddTarget(\"out\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    pTVar5 = g_current_test;
    iVar9 = std::__cxx11::string::compare((char *)&local_2c0);
    bVar8 = testing::Test::Check
                      (pTVar5,iVar9 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x896,"\"\" == err");
    pTVar5 = g_current_test;
    if (bVar8) {
      condition = Builder::Build((Builder *)local_2a0,&local_2c0);
      testing::Test::Check
                (pTVar5,condition,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x897,"builder.Build(&err)");
      pTVar5 = g_current_test;
      iVar9 = std::__cxx11::string::compare((char *)&local_2c0);
      testing::Test::Check
                (pTVar5,iVar9 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x898,"\"\" == err");
      DepsLog::Close(&local_90);
      local_220._M_head_impl = (CommandRunner *)0x0;
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    Builder::~Builder((Builder *)local_2a0);
    DepsLog::~DepsLog(&local_90);
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
    local_148 = &PTR__BindingEnv_001d6ce0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
    ::~_Rb_tree(&local_110);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_140);
    if (local_160 != (pointer)0x0) {
      operator_delete(local_160,(long)local_150 - (long)local_160);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
    ::~_Rb_tree(&local_190);
    std::
    _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_1c8);
    if (!bVar8) goto LAB_00131200;
    p_Var1 = &local_2c8[2].state_.paths_._M_h._M_before_begin;
    *(int *)&p_Var1->_M_nxt = *(int *)&p_Var1->_M_nxt + 1;
    local_1c8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"in1","");
    local_2a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
    VirtualFileSystem::Create(this_00,(string *)local_1c8,(string *)local_2a0);
    if ((pointer)local_2a0._0_8_ != pcVar2) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    if ((pointer)local_1c8._0_8_ != pcVar3) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    local_1c8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"out","");
    local_2a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
    VirtualFileSystem::Create(this_00,(string *)local_1c8,(string *)local_2a0);
    if ((pointer)local_2a0._0_8_ != pcVar2) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    if ((pointer)local_1c8._0_8_ != pcVar3) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    pTVar5 = g_current_test;
    local_1c8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"in1.d","");
    TVar13 = VirtualFileSystem::Stat(this_00,(string *)local_1c8,&local_2c0);
    testing::Test::Check
              (pTVar5,TVar13 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x8a5,"0 == fs_.Stat(\"in1.d\", &err)");
    if ((pointer)local_1c8._0_8_ != pcVar3) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    State::State((State *)local_1c8);
    iVar9 = g_current_test->assertion_failures_;
    StateTestWithBuiltinRules::AddCatRule(local_2c8,(State *)local_1c8);
    if (iVar9 == g_current_test->assertion_failures_) {
      AssertParse((State *)local_1c8,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                  (ManifestParserOptions)0x0);
      pTVar5 = g_current_test;
      if (iVar9 == g_current_test->assertion_failures_) {
        local_90.needs_recompaction_ = false;
        local_90.file_ = (FILE *)0x0;
        local_90.file_path_._M_dataplus._M_p = (pointer)&local_90.file_path_.field_2;
        local_90.file_path_._M_string_length = 0;
        local_90.file_path_.field_2._M_local_buf[0] = '\0';
        local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a0._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"ninja_deps","");
        LVar11 = DepsLog::Load(&local_90,(string *)local_2a0,(State *)local_1c8,&local_2c0);
        bVar8 = testing::Test::Check
                          (pTVar5,LVar11 != LOAD_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x8ad,"deps_log.Load(\"ninja_deps\", &state, &err)");
        if ((pointer)local_2a0._0_8_ != pcVar2) {
          operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
        }
        pTVar5 = g_current_test;
        if (bVar8) {
          local_2a0._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"ninja_deps","");
          bVar8 = DepsLog::OpenForWrite(&local_90,(string *)local_2a0,&local_2c0);
          bVar8 = testing::Test::Check
                            (pTVar5,bVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x8ae,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
          if ((pointer)local_2a0._0_8_ != pcVar2) {
            operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
          }
          if (bVar8) {
            Builder::Builder((Builder *)local_2a0,(State *)local_1c8,local_b8,(BuildLog *)0x0,
                             &local_90,&this_00->super_DiskInterface);
            _Var7._M_head_impl = (CommandRunner *)local_220;
            local_220._M_head_impl = (CommandRunner *)local_c0;
            if ((_Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>)
                _Var7._M_head_impl != (CommandRunner *)0x0) {
              (**(code **)(*(size_type *)_Var7._M_head_impl + 8))();
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_2c8[1].state_.paths_._M_h._M_rehash_policy,
                              *(pointer *)
                               &local_2c8[1].state_.paths_._M_h._M_rehash_policy._M_max_load_factor)
            ;
            pTVar5 = g_current_test;
            local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"out","");
            pNVar12 = Builder::AddTarget((Builder *)local_2a0,&local_2e8,&local_2c0);
            testing::Test::Check
                      (pTVar5,pNVar12 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x8b3,"builder.AddTarget(\"out\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
              operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar5 = g_current_test;
            iVar9 = std::__cxx11::string::compare((char *)&local_2c0);
            bVar8 = testing::Test::Check
                              (pTVar5,iVar9 == 0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x8b4,"\"\" == err");
            if (bVar8) {
              local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"in1.d","");
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"out: ","");
              VirtualFileSystem::Create(this_00,&local_2e8,&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p,
                                local_2e8.field_2._M_allocated_capacity + 1);
              }
              pTVar5 = g_current_test;
              bVar8 = Builder::Build((Builder *)local_2a0,&local_2c0);
              testing::Test::Check
                        (pTVar5,bVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8b9,"builder.Build(&err)");
              pTVar5 = g_current_test;
              iVar9 = std::__cxx11::string::compare((char *)&local_2c0);
              testing::Test::Check
                        (pTVar5,iVar9 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8ba,"\"\" == err");
              testing::Test::Check
                        (g_current_test,
                         local_2c8[1].state_.paths_._M_h._M_rehash_policy._M_next_resize -
                         *(long *)&local_2c8[1].state_.paths_._M_h._M_rehash_policy.
                                   _M_max_load_factor == 0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8be,"1u == command_runner_.commands_ran_.size()");
              local_220._M_head_impl = (CommandRunner *)0x0;
            }
            else {
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            }
            Builder::~Builder((Builder *)local_2a0);
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
        DepsLog::~DepsLog(&local_90);
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
  }
  else {
LAB_0013117b:
    g_current_test->assertion_failures_ = iVar10 + 1;
LAB_00131184:
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
  }
  local_148 = &PTR__BindingEnv_001d6ce0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_110);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_140);
  if (local_160 != (pointer)0x0) {
    operator_delete(local_160,(long)local_150 - (long)local_160);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_190);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1c8);
LAB_00131200:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, ObsoleteDeps) {
  string err;
  // Note: in1 was created by the superclass SetUp().
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";
  {
    // Run an ordinary build that gathers dependencies.
    fs_.Create("in1", "");
    fs_.Create("in1.d", "out: ");

    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    deps_log.Close();
    builder.command_runner_.release();
  }

  // Push all files one tick forward so that only the deps are out
  // of date.
  fs_.Tick();
  fs_.Create("in1", "");
  fs_.Create("out", "");

  // The deps file should have been removed, so no need to timestamp it.
  EXPECT_EQ(0, fs_.Stat("in1.d", &err));

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    command_runner_.commands_ran_.clear();
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);

    // Recreate the deps file here because the build expects them to exist.
    fs_.Create("in1.d", "out: ");

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // We should have rebuilt the output due to the deps being
    // out of date.
    EXPECT_EQ(1u, command_runner_.commands_ran_.size());

    builder.command_runner_.release();
  }
}